

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::SscReader::EndStep(SscReader *this)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  ScopedTimer __var281;
  string local_90;
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  
  if (EndStep()::__var81 == '\0') {
    iVar2 = __cxa_guard_acquire(&EndStep()::__var81);
    if (iVar2 != 0) {
      uVar4 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscReader.cpp"
                                  ,"virtual void adios2::core::engine::SscReader::EndStep()",0x51);
      EndStep::__var81 = (void *)ps_timer_create_(uVar4);
      __cxa_guard_release(&EndStep()::__var81);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var281,EndStep::__var81);
  std::__cxx11::string::string(local_30,"Engine",&local_99);
  std::__cxx11::string::string(local_50,"SscReader",&local_9a);
  std::__cxx11::string::string(local_70,"EndStep",&local_9b);
  iVar2 = (*((this->m_EngineInstance).
             super___shared_ptr<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_SscReaderBase[3])();
  std::__cxx11::to_string(&local_90,CONCAT44(extraout_var,iVar2));
  iVar2 = 0;
  if (9 < this->m_Verbosity) {
    iVar2 = adios2::helper::Comm::Rank();
  }
  iVar3 = adios2::helper::Comm::Rank();
  adios2::helper::Log(local_30,local_50,local_70,(string *)&local_90,iVar2,iVar3,5,this->m_Verbosity
                      ,INFO);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  peVar1 = (this->m_EngineInstance).
           super___shared_ptr<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_SscReaderBase[5])(peVar1,(ulong)(byte)this->field_0x83);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var281);
  return;
}

Assistant:

void SscReader::EndStep()
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    helper::Log("Engine", "SscReader", "EndStep", std::to_string(CurrentStep()),
                m_Verbosity >= 10 ? m_Comm.Rank() : 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);

    return m_EngineInstance->EndStep(m_ReaderSelectionsLocked);
}